

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void notify_service_state(char *name,char *state)

{
  size_t sVar1;
  char *in_RDI;
  int len;
  char pname [92];
  char *in_stack_ffffffffffffff78;
  char local_78 [112];
  char *local_8;
  
  local_8 = in_RDI;
  sVar1 = strlen(in_RDI);
  if ((int)sVar1 + 10 < 0x5d) {
    snprintf(local_78,0x5c,"init.svc.%s",local_8);
    property_set(in_stack_ffffffffffffff78,(char *)0x106372);
  }
  return;
}

Assistant:

static void notify_service_state(const char *name, const char *state)
{
    char pname[PROP_NAME_MAX];
    int len = strlen(name);
    if ((len + 10) > PROP_NAME_MAX)
        return;
    snprintf(pname, sizeof(pname), "init.svc.%s", name);
    property_set(pname, state);
}